

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_raytracing_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  VkRayTracingPipelineCreateInfoKHR *pVVar2;
  Value *pVVar3;
  DatabaseInterface *pDVar4;
  bool bVar5;
  uint uVar6;
  SizeType SVar7;
  Ch *str;
  size_type sVar8;
  Type pGVar9;
  VkPipelineCreateFlags2KHR VVar10;
  mapped_type *ppVVar11;
  VkPipelineLibraryCreateInfoKHR *local_68;
  VkPipelineLibraryCreateInfoKHR *library_info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *lib_info;
  VkRayTracingPipelineCreateInfoKHR *info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  VkRayTracingPipelineCreateInfoKHR *info_allocated;
  Hash hash;
  Value *member_local;
  Value *pipelines_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  hash = (Hash)member;
  member_local = pipelines;
  pipelines_local = (Value *)resolver;
  resolver_local = (DatabaseInterface *)iface;
  iface_local = (StateCreatorInterface *)this;
  str = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(member);
  info_allocated = (VkRayTracingPipelineCreateInfoKHR *)string_to_uint64(str);
  sVar8 = std::
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          ::count(&this->replayed_raytracing_pipelines,(key_type *)&info_allocated);
  if (sVar8 == 0) {
    obj = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *)ScratchAllocator::allocate_cleared<VkRayTracingPipelineCreateInfoKHR>(&this->allocator)
    ;
    info = (VkRayTracingPipelineCreateInfoKHR *)
           rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)member_local,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)hash);
    lib_info = obj;
    (obj->data_).s.length = 0x3b9d13ff;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)info,"flags");
    uVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar9);
    lib_info[1].data_.s.length = uVar6;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)info,"basePipelineIndex");
    SVar7 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pGVar9);
    lib_info[6].data_.s.length = SVar7;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)info,"maxPipelineRayRecursionDepth");
    uVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar9);
    lib_info[3].data_.s.length = uVar6;
    VVar10 = normalize_pipeline_creation_flags((ulong)lib_info[1].data_.s.length);
    lib_info[1].data_.s.length = (SizeType)VVar10;
    bVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)info,"stages");
    if (bVar5) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"stages");
      SVar7 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar9);
      pDVar4 = resolver_local;
      pVVar3 = pipelines_local;
      lib_info[1].data_.s.hashcode = SVar7;
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"stages");
      bVar5 = parse_stages(this,(StateCreatorInterface *)pDVar4,(DatabaseInterface *)pVVar3,pGVar9,
                           (VkPipelineShaderStageCreateInfo **)&lib_info[1].data_.o.members);
      if (!bVar5) {
        return false;
      }
    }
    bVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)info,"groups");
    if (bVar5) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"groups");
      SVar7 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar9);
      lib_info[2].data_.s.length = SVar7;
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"groups");
      bVar5 = parse_raytracing_groups
                        (this,pGVar9,
                         (VkRayTracingShaderGroupCreateInfoKHR **)&lib_info[2].data_.o.members);
      if (!bVar5) {
        return false;
      }
    }
    bVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)info,"libraryInterface");
    if (bVar5) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"libraryInterface");
      bVar5 = parse_library_interface
                        (this,pGVar9,(VkRayTracingPipelineInterfaceCreateInfoKHR **)(lib_info + 4));
      if (!bVar5) {
        return false;
      }
    }
    bVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)info,"libraryInfo");
    if (bVar5) {
      library_info = (VkPipelineLibraryCreateInfoKHR *)
                     rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)info,"libraryInfo");
      local_68 = (VkPipelineLibraryCreateInfoKHR *)0x0;
      bVar5 = parse_pipeline_library
                        (this,(StateCreatorInterface *)resolver_local,
                         (DatabaseInterface *)pipelines_local,member_local,(Value *)library_info,
                         RESOURCE_RAYTRACING_PIPELINE,&local_68);
      if (!bVar5) {
        return false;
      }
      lib_info[3].data_.s.str = (Ch *)local_68;
    }
    bVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)info,"dynamicState");
    if (bVar5) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"dynamicState");
      bVar5 = parse_dynamic_state(this,pGVar9,
                                  (VkPipelineDynamicStateCreateInfo **)&lib_info[4].data_.o.members)
      ;
      if (!bVar5) {
        return false;
      }
    }
    pDVar4 = resolver_local;
    pVVar3 = pipelines_local;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)info,"basePipelineHandle");
    bVar5 = parse_derived_pipeline_handle
                      (this,(StateCreatorInterface *)pDVar4,(DatabaseInterface *)pVVar3,pGVar9,
                       member_local,RESOURCE_RAYTRACING_PIPELINE,
                       (VkPipeline *)&lib_info[5].data_.o.members);
    if (bVar5) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)info,"layout");
      bVar5 = parse_pipeline_layout_handle(this,pGVar9,(VkPipelineLayout *)(lib_info + 5));
      if (bVar5) {
        bVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)info,"pNext");
        if (bVar5) {
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)info,"pNext");
          bVar5 = parse_pnext_chain(this,pGVar9,&(lib_info->data_).s.str,
                                    (StateCreatorInterface *)0x0,(DatabaseInterface *)0x0,
                                    (Value *)0x0);
          if (!bVar5) {
            return false;
          }
        }
        pDVar4 = resolver_local;
        pVVar2 = info_allocated;
        pGVar1 = lib_info;
        ppVVar11 = std::
                   unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                   ::operator[](&this->replayed_raytracing_pipelines,(key_type *)&info_allocated);
        uVar6 = (*pDVar4->_vptr_DatabaseInterface[0xd])(pDVar4,pVVar2,pGVar1,ppVVar11);
        if ((uVar6 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool StateReplayer::Impl::parse_raytracing_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                    const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_raytracing_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkRayTracingPipelineCreateInfoKHR>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();
	info.maxPipelineRayRecursionDepth = obj["maxPipelineRayRecursionDepth"].GetUint();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (obj.HasMember("stages"))
	{
		info.stageCount = obj["stages"].Size();
		if (!parse_stages(iface, resolver, obj["stages"], &info.pStages))
			return false;
	}

	if (obj.HasMember("groups"))
	{
		info.groupCount = obj["groups"].Size();
		if (!parse_raytracing_groups(obj["groups"], &info.pGroups))
			return false;
	}

	if (obj.HasMember("libraryInterface"))
		if (!parse_library_interface(obj["libraryInterface"], &info.pLibraryInterface))
			return false;

	if (obj.HasMember("libraryInfo"))
	{
		auto &lib_info = obj["libraryInfo"];
		VkPipelineLibraryCreateInfoKHR *library_info = nullptr;
		if (!parse_pipeline_library(iface, resolver, pipelines, lib_info, RESOURCE_RAYTRACING_PIPELINE, &library_info))
			return false;
		info.pLibraryInfo = library_info;
	}

	if (obj.HasMember("dynamicState"))
		if (!parse_dynamic_state(obj["dynamicState"], &info.pDynamicState))
			return false;

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_RAYTRACING_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext))
			return false;

	if (!iface.enqueue_create_raytracing_pipeline(hash, &info, &replayed_raytracing_pipelines[hash]))
		return false;

	return true;
}